

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

void __thiscall
duckdb::StandardBufferManager::StandardBufferManager
          (StandardBufferManager *this,DatabaseInstance *db,string *tmp)

{
  _Head_base<0UL,_duckdb::BlockManager_*,_false> _Var1;
  idx_t i;
  BufferPool *pBVar2;
  PrivateAllocatorData *this_00;
  _Head_base<0UL,_duckdb::BlockManager_*,_false> this_01;
  long lVar3;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> local_40;
  optional_idx local_38;
  optional_idx local_30;
  
  (this->super_BufferManager)._vptr_BufferManager =
       (_func_int **)&PTR__StandardBufferManager_024488a8;
  this->db = db;
  pBVar2 = DatabaseInstance::GetBufferPool(db);
  this->buffer_pool = pBVar2;
  (this->temporary_directory).path._M_dataplus._M_p =
       (pointer)&(this->temporary_directory).path.field_2;
  (this->temporary_directory).path._M_string_length = 0;
  (this->temporary_directory).path.field_2._M_local_buf[0] = '\0';
  (this->temporary_directory).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->temporary_directory).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->temporary_directory).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->temporary_directory).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->temporary_directory).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->temporary_directory).size_on_disk.super___atomic_base<unsigned_long>._M_i = 0;
  (this->temporary_directory).handle.
  super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
  .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl =
       (TemporaryDirectoryHandle *)0x0;
  (this->temporary_directory).maximum_swap_space.index = 0xffffffffffffffff;
  (this->temporary_id).super___atomic_base<long>._M_i = 0x4000000000000060;
  this_00 = (PrivateAllocatorData *)operator_new(0x20);
  PrivateAllocatorData::PrivateAllocatorData(this_00);
  this_00->_vptr_PrivateAllocatorData = (_func_int **)&PTR__PrivateAllocatorData_02449718;
  this_00[1]._vptr_PrivateAllocatorData = (_func_int **)this;
  local_40._M_head_impl = this_00;
  Allocator::Allocator
            (&this->buffer_allocator,BufferAllocatorAllocate,BufferAllocatorFree,
             BufferAllocatorRealloc,
             (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>,_true>
              *)&local_40);
  if (local_40._M_head_impl != (PrivateAllocatorData *)0x0) {
    (*(local_40._M_head_impl)->_vptr_PrivateAllocatorData[1])();
  }
  local_40._M_head_impl = (PrivateAllocatorData *)0x0;
  (this->temp_block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = (BlockManager *)0x0;
  this_01._M_head_impl = (BlockManager *)operator_new(0x88);
  optional_idx::optional_idx(&local_30,0x40000);
  optional_idx::optional_idx(&local_38,8);
  BlockManager::BlockManager(this_01._M_head_impl,&this->super_BufferManager,local_30,local_38);
  (this_01._M_head_impl)->_vptr_BlockManager = (_func_int **)&PTR__BlockManager_024495d0;
  _Var1._M_head_impl =
       (this->temp_block_manager).
       super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
       super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl;
  (this->temp_block_manager).
  super_unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockManager_*,_std::default_delete<duckdb::BlockManager>_>.
  super__Head_base<0UL,_duckdb::BlockManager_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var1._M_head_impl != (BlockManager *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockManager + 8))();
  }
  ::std::__cxx11::string::operator=((string *)&this->temporary_directory,(string *)tmp);
  lVar3 = 0;
  do {
    LOCK();
    this->evicted_data_per_tag[lVar3].super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xe);
  return;
}

Assistant:

StandardBufferManager::StandardBufferManager(DatabaseInstance &db, string tmp)
    : BufferManager(), db(db), buffer_pool(db.GetBufferPool()), temporary_id(MAXIMUM_BLOCK),
      buffer_allocator(BufferAllocatorAllocate, BufferAllocatorFree, BufferAllocatorRealloc,
                       make_uniq<BufferAllocatorData>(*this)) {
	temp_block_manager =
	    make_uniq<InMemoryBlockManager>(*this, DEFAULT_BLOCK_ALLOC_SIZE, DEFAULT_BLOCK_HEADER_STORAGE_SIZE);
	temporary_directory.path = std::move(tmp);
	for (idx_t i = 0; i < MEMORY_TAG_COUNT; i++) {
		evicted_data_per_tag[i] = 0;
	}
}